

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathIntersection(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  uint uVar3;
  
  cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
  if (cur == (xmlNodeSetPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
  }
  else {
    cur->nodeNr = 0;
    cur->nodeMax = 0;
    cur->nodeTab = (xmlNodePtr *)0x0;
    if (((((nodes1 != (xmlNodeSetPtr)0x0) && (iVar1 = nodes1->nodeNr, iVar1 != 0)) &&
         (nodes2 != (xmlNodeSetPtr)0x0)) &&
        ((nodes1->nodeTab != (xmlNodePtr *)0x0 && (nodes2->nodeNr != 0)))) &&
       (0 < iVar1 && nodes2->nodeTab != (xmlNodePtr *)0x0)) {
      uVar3 = 0;
      iVar2 = iVar1;
      while( true ) {
        if ((int)uVar3 < iVar2) {
          val = nodes1->nodeTab[uVar3];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
        iVar2 = xmlXPathNodeSetContains(nodes2,val);
        if ((iVar2 != 0) && (iVar2 = xmlXPathNodeSetAddUnique(cur,val), iVar2 < 0)) break;
        uVar3 = uVar3 + 1;
        if (iVar1 <= (int)uVar3) {
          return cur;
        }
        iVar2 = nodes1->nodeNr;
      }
      return cur;
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathIntersection (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    xmlNodeSetPtr ret = xmlXPathNodeSetCreate(NULL);
    int i, l1;
    xmlNodePtr cur;

    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(ret);

    l1 = xmlXPathNodeSetGetLength(nodes1);

    for (i = 0; i < l1; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (xmlXPathNodeSetContains(nodes2, cur)) {
            /* TODO: Propagate memory error. */
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        break;
	}
    }
    return(ret);
}